

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kyber.cc
# Opt level: O0

void KYBER_decap(uint8_t *out_shared_secret,uint8_t *ciphertext,KYBER_private_key *private_key)

{
  byte bVar1;
  uint8_t uVar2;
  int a;
  int local_53c;
  uint8_t local_538 [4];
  int i;
  uint8_t input [64];
  uint8_t local_4e8 [7];
  uint8_t mask;
  uint8_t expected_ciphertext [1088];
  uint8_t prekey_and_randomness [64];
  uint8_t decrypted [64];
  private_key *priv;
  KYBER_private_key *private_key_local;
  uint8_t *ciphertext_local;
  uint8_t *out_shared_secret_local;
  
  decrypted._56_8_ = anon_unknown.dwarf_2205c3::private_key_from_external(private_key);
  decrypt_cpa(prekey_and_randomness + 0x38,(private_key *)decrypted._56_8_,ciphertext);
  OPENSSL_memcpy(decrypted + 0x18,(void *)(decrypted._56_8_ + 0x620),0x20);
  hash_g(expected_ciphertext + 0x438,prekey_and_randomness + 0x38,0x40);
  encrypt_cpa(local_4e8,(public_key *)decrypted._56_8_,prekey_and_randomness + 0x38,
              prekey_and_randomness + 0x18);
  a = CRYPTO_memcmp(ciphertext,local_4e8,0x440);
  bVar1 = constant_time_eq_int_8(a,0);
  for (local_53c = 0; local_53c < 0x20; local_53c = local_53c + 1) {
    uVar2 = constant_time_select_8
                      ((ulong)bVar1,expected_ciphertext[(long)local_53c + 0x438],
                       *(uint8_t *)(decrypted._56_8_ + 0x1e40 + (long)local_53c));
    local_538[local_53c] = uVar2;
  }
  hash_h(input + 0x18,ciphertext,0x440);
  kdf(out_shared_secret,0x20,local_538,0x40);
  return;
}

Assistant:

void KYBER_decap(uint8_t out_shared_secret[KYBER_SHARED_SECRET_BYTES],
                 const uint8_t ciphertext[KYBER_CIPHERTEXT_BYTES],
                 const struct KYBER_private_key *private_key) {
  const struct private_key *priv = private_key_from_external(private_key);
  uint8_t decrypted[64];
  decrypt_cpa(decrypted, priv, ciphertext);
  OPENSSL_memcpy(decrypted + 32, priv->pub.public_key_hash,
                 sizeof(decrypted) - 32);
  uint8_t prekey_and_randomness[64];
  hash_g(prekey_and_randomness, decrypted, sizeof(decrypted));
  uint8_t expected_ciphertext[KYBER_CIPHERTEXT_BYTES];
  encrypt_cpa(expected_ciphertext, &priv->pub, decrypted,
              prekey_and_randomness + 32);
  uint8_t mask =
      constant_time_eq_int_8(CRYPTO_memcmp(ciphertext, expected_ciphertext,
                                           sizeof(expected_ciphertext)),
                             0);
  uint8_t input[64];
  for (int i = 0; i < 32; i++) {
    input[i] = constant_time_select_8(mask, prekey_and_randomness[i],
                                      priv->fo_failure_secret[i]);
  }
  hash_h(input + 32, ciphertext, KYBER_CIPHERTEXT_BYTES);
  kdf(out_shared_secret, KYBER_SHARED_SECRET_BYTES, input, sizeof(input));
}